

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool __thiscall
FillableSigningProvider::GetKey(FillableSigningProvider *this,CKeyID *address,CKey *keyOut)

{
  long lVar1;
  bool bVar2;
  char *in_RDX;
  AnnotatedMixin<std::recursive_mutex> *in_RSI;
  CKey *in_RDI;
  long in_FS_OFFSET;
  const_iterator mi;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 fTry;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  CKey *this_00;
  
  fTry = (undefined1)((uint)in_stack_ffffffffffffffa8 >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00,in_RSI,in_RDX,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(bool)fTry);
  std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::find
            ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (key_type *)in_stack_ffffffffffffff88);
  std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::end
            ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  bVar2 = std::operator==((_Self *)in_RDI,
                          (_Self *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (bVar2) {
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_> *)in_stack_ffffffffffffff88)
    ;
    CKey::operator=(in_RDI,(CKey *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool FillableSigningProvider::GetKey(const CKeyID &address, CKey &keyOut) const
{
    LOCK(cs_KeyStore);
    KeyMap::const_iterator mi = mapKeys.find(address);
    if (mi != mapKeys.end()) {
        keyOut = mi->second;
        return true;
    }
    return false;
}